

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularString::GenerateAccessorDeclarations
          (SingularString *this,Printer *p)

{
  Descriptor *descriptor;
  bool bVar1;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> in_R9;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  Span<const_google::protobuf::io::Printer::Sub> vars_01;
  Span<const_google::protobuf::io::Printer::Sub> vars_02;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes;
  Span<const_std::basic_string_view<char,_std::char_traits<char>_>_> prefixes_00;
  string_view prefix;
  allocator<char> local_281;
  char *local_280;
  char *local_278;
  char local_270 [8];
  once_flag *poStack_268;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  vars;
  Printer *p_local;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v1;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v2;
  undefined1 local_208 [64];
  __index_type local_1c8;
  _Alloc_hider local_1c0;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  bool local_1a0;
  bool local_158;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v3;
  string local_138;
  AnnotationRecord local_118;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  
  p_local = p;
  bVar1 = protobuf::internal::cpp::IsStringFieldWithPrivatizedAccessors
                    ((this->super_FieldGeneratorBase).field_);
  if (bVar1) {
    io::Printer::Emit(p,0x3c,"\n      private:  // Hidden due to unknown ctype option.\n    ");
  }
  local_208._16_8_ = (FileDescriptor *)0xe;
  local_208._24_8_ = (long)"unsafe_arena_set_allocated_" + 0xd;
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = "";
  AnnotatedAccessors(&vars,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)local_208,
                     (Span<const_std::basic_string_view<char,_std::char_traits<char>_>_>)ZEXT816(2),
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"release_name",(allocator<char> *)&v2);
  descriptor = (Descriptor *)(this->super_FieldGeneratorBase).field_;
  prefix._M_str = (char *)in_R9;
  prefix._M_len = (size_t)"release_";
  SafeFunctionName_abi_cxx11_
            ((string *)&v1,(cpp *)descriptor->containing_type_,descriptor,(FieldDescriptor *)0x8,
             prefix);
  io::Printer::Sub::Sub<std::__cxx11::string>
            ((Sub *)&local_d8,&local_138,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v1);
  io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::FieldDescriptor,_0>
            (&local_118,(this->super_FieldGeneratorBase).field_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  io::Printer::Sub::AnnotatedAs((Sub *)local_208,(Sub *)&local_d8,&local_118);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  emplace_back<google::protobuf::io::Printer::Sub>(&vars,(Sub *)local_208);
  io::Printer::Sub::~Sub((Sub *)local_208);
  io::Printer::AnnotationRecord::~AnnotationRecord(&local_118);
  io::Printer::Sub::~Sub((Sub *)&local_d8);
  std::__cxx11::string::~string((string *)&v1);
  std::__cxx11::string::~string((string *)&local_138);
  vars_00.len_ = ((long)vars.
                        super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vars.
                       super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0xb8;
  vars_00.ptr_ = vars.
                 super__Vector_base<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  io::Printer::WithVars(&v1,p,vars_00);
  local_d8._M_unused._M_member_pointer = 4;
  local_d8._8_8_ = (long)"_internal_set_" + 10;
  prefixes.len_ = 0x100000001;
  prefixes.ptr_ = (pointer)0x1;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_208,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)&local_d8,prefixes,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_01.len_ = (long)(local_208._8_8_ - local_208._0_8_) / 0xb8;
  vars_01.ptr_ = (pointer)local_208._0_8_;
  io::Printer::WithVars(&v2,p,vars_01);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_208);
  local_d8._M_unused._M_member_pointer = 8;
  local_d8._8_8_ = (long)"_internal_mutable_" + 10;
  prefixes_00.len_ = 0x100000002;
  prefixes_00.ptr_ = (pointer)0x1;
  AnnotatedAccessors((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                      *)local_208,(cpp *)(this->super_FieldGeneratorBase).field_,
                     (FieldDescriptor *)&local_d8,prefixes_00,
                     (optional<google::protobuf::io::AnnotationCollector::Semantic>)in_R9);
  vars_02.len_ = (long)(local_208._8_8_ - local_208._0_8_) / 0xb8;
  vars_02.ptr_ = (pointer)local_208._0_8_;
  io::Printer::WithVars(&v3,p,vars_02);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)local_208);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"donated",&local_281);
  local_208._0_8_ = local_208 + 0x10;
  if (local_280 == local_270) {
    local_208._24_8_ = poStack_268;
  }
  else {
    local_208._0_8_ = local_280;
  }
  local_208._8_8_ = local_278;
  local_278 = (char *)0x0;
  local_270[0] = '\0';
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_280 = local_270;
  local_d8._M_unused._M_object = operator_new(0x18);
  *(SingularString **)local_d8._M_unused._0_8_ = this;
  *(Printer ***)((long)local_d8._M_unused._0_8_ + 8) = &p_local;
  *(code *)((long)local_d8._M_unused._0_8_ + 0x10) = (code)0x0;
  pcStack_c0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
             ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            ((variant<std::__cxx11::string,std::function<bool()>> *)(local_208 + 0x20),
             (function<bool_()> *)&local_d8);
  std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  local_1c0._M_p = (pointer)&local_1b0;
  local_1b8.default_value_int64_t_ = 0;
  local_1b0._M_local_buf[0] = '\0';
  local_1a0 = false;
  if (local_1c8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_1c0);
  }
  local_158 = false;
  io::Printer::Emit(p,local_208,1,0x3ed,
                    "\n            $DEPRECATED$ const ::std::string& $name$() const;\n            //~ Using `Arg_ = const std::string&` will make the type of `arg`\n            //~ default to `const std::string&`, due to reference collapse. This\n            //~ is necessary because there are a handful of users that rely on\n            //~ this default.\n            template <typename Arg_ = const ::std::string&, typename... Args_>\n            $DEPRECATED$ void $set_name$(Arg_&& arg, Args_... args);\n            $DEPRECATED$ ::std::string* $nonnull$ $mutable_name$();\n            $DEPRECATED$ [[nodiscard]] ::std::string* $nullable$ $release_name$();\n            $DEPRECATED$ void $set_allocated_name$(::std::string* $nullable$ value);\n\n            private:\n            const ::std::string& _internal_$name$() const;\n            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(const ::std::string& value);\n            ::std::string* $nonnull$ _internal_mutable_$name$();\n            $donated$;\n\n            public:\n          "
                   );
  io::Printer::Sub::~Sub((Sub *)local_208);
  std::__cxx11::string::~string((string *)&local_280);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v3);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v2);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&v1);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&vars);
  return;
}

Assistant:

void SingularString::GenerateAccessorDeclarations(io::Printer* p) const {
  // If we're using SingularString for a field with a ctype, it's
  // because that ctype isn't actually implemented.  In particular, this is
  // true of ctype=CORD and ctype=STRING_PIECE in the open source release.
  // We aren't releasing Cord because it has too many Google-specific
  // dependencies and we aren't releasing StringPiece because it's hardly
  // useful outside of Google and because it would get confusing to have
  // multiple instances of the StringPiece class in different libraries (PCRE
  // already includes it for their C++ bindings, which came from Google).
  //
  // In any case, we make all the accessors private while still actually
  // using a string to represent the field internally.  This way, we can
  // guarantee that if we do ever implement the ctype, it won't break any
  // existing users who might be -- for whatever reason -- already using .proto
  // files that applied the ctype.  The field can still be accessed via the
  // reflection interface since the reflection interface is independent of
  // the string's underlying representation.
  if (internal::cpp::IsStringFieldWithPrivatizedAccessors(*field_)) {
    p->Emit(R"cc(
      private:  // Hidden due to unknown ctype option.
    )cc");
  }

  auto vars = AnnotatedAccessors(field_, {"", "set_allocated_"});
  vars.push_back(Sub{
      "release_name",
      SafeFunctionName(field_->containing_type(), field_, "release_"),
  }
                     .AnnotatedAs(field_));
  auto v1 = p->WithVars(vars);
  auto v2 = p->WithVars(
      AnnotatedAccessors(field_, {"set_"}, AnnotationCollector::kSet));
  auto v3 = p->WithVars(
      AnnotatedAccessors(field_, {"mutable_"}, AnnotationCollector::kAlias));

  p->Emit({{"donated",
            [&] {
              if (!is_inlined()) return;
              p->Emit(R"cc(
                PROTOBUF_ALWAYS_INLINE bool _internal_$name$_donated() const;
              )cc");
            }}},
          R"cc(
            $DEPRECATED$ const ::std::string& $name$() const;
            //~ Using `Arg_ = const std::string&` will make the type of `arg`
            //~ default to `const std::string&`, due to reference collapse. This
            //~ is necessary because there are a handful of users that rely on
            //~ this default.
            template <typename Arg_ = const ::std::string&, typename... Args_>
            $DEPRECATED$ void $set_name$(Arg_&& arg, Args_... args);
            $DEPRECATED$ ::std::string* $nonnull$ $mutable_name$();
            $DEPRECATED$ [[nodiscard]] ::std::string* $nullable$ $release_name$();
            $DEPRECATED$ void $set_allocated_name$(::std::string* $nullable$ value);

            private:
            const ::std::string& _internal_$name$() const;
            PROTOBUF_ALWAYS_INLINE void _internal_set_$name$(const ::std::string& value);
            ::std::string* $nonnull$ _internal_mutable_$name$();
            $donated$;

            public:
          )cc");
}